

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Shader *shader,uint32_t indent,
          bool closing_brace)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar6;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  uint32_t extraout_EDX_36;
  uint32_t extraout_EDX_37;
  uint32_t extraout_EDX_38;
  uint32_t extraout_EDX_39;
  uint32_t extraout_EDX_40;
  uint32_t extraout_EDX_41;
  uint32_t extraout_EDX_42;
  uint32_t extraout_EDX_43;
  uint32_t extraout_EDX_44;
  uint32_t extraout_EDX_45;
  uint32_t extraout_EDX_46;
  undefined1 *puVar7;
  char *pcVar8;
  undefined3 in_register_00000081;
  uint32_t uVar9;
  uint uVar10;
  tinyusdz *this_00;
  pprint *this_01;
  undefined1 *puVar11;
  stringstream ss;
  stringstream ss_1;
  optional<tinyusdz::UsdUVTexture> pvtex;
  optional<tinyusdz::ShaderNode> pvsn;
  optional<tinyusdz::UsdPrimvarReader<float>_> pvr;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> pvr3;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> pvr4;
  optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pvrs;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> pvrp;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> pvrv;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> pvrn;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> pvr2;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> pvrm;
  optional<tinyusdz::UsdTransform2d> pvtx2d;
  char cStack_1228c;
  stringstream asStack_12280 [16];
  ostream aoStack_12270 [112];
  ios_base aiStack_12200 [264];
  undefined1 auStack_120f8 [8];
  undefined1 auStack_120f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_120e8 [7];
  ios_base aiStack_12078 [11976];
  undefined1 local_f1b0 [1848];
  undefined1 local_ea78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea68 [605];
  undefined1 local_c490 [8];
  undefined1 local_c488 [12096];
  stringstream local_9548;
  UsdPrimvarReader<float> local_9540;
  stringstream local_8700;
  UsdPrimvarReader<std::array<float,_3UL>_> local_86f8;
  stringstream local_78b0;
  UsdPrimvarReader<std::array<float,_4UL>_> local_78a8;
  stringstream local_6a58;
  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a50;
  stringstream local_5bf0;
  UsdPrimvarReader<tinyusdz::value::point3f> local_5be8;
  stringstream local_4da0;
  UsdPrimvarReader<tinyusdz::value::vector3f> local_4d98;
  stringstream local_3f50;
  UsdPrimvarReader<tinyusdz::value::normal3f> local_3f48;
  stringstream local_3100;
  UsdPrimvarReader<std::array<float,_2UL>_> local_30f8;
  stringstream local_22b0;
  UsdPrimvarReader<tinyusdz::value::matrix4d> local_22a8;
  stringstream local_13e8;
  UsdTransform2d local_13e0;
  
  uVar9 = CONCAT31(in_register_00000081,closing_brace);
  this_01 = (pprint *)((ulong)shader & 0xffffffff);
  uVar5 = indent;
  std::__cxx11::stringstream::stringstream(asStack_12280);
  pprint::Indent_abi_cxx11_((string *)auStack_120f8,this_01,n);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      (long)auStack_120f0);
  to_string_abi_cxx11_((string *)local_c490,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Shader \"",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)this,*(long *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
  if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != local_c488 + 8) {
    operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._8_8_ + 1);
  }
  if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
    operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                    aaStack_120e8[0]._M_allocated_capacity + 1);
  }
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x30));
  iVar1 = (int)shader;
  uVar6 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_((string *)auStack_120f8,this_01,n_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                        (long)auStack_120f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(\n",2);
    if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
      operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      aaStack_120e8[0]._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_
              ((string *)auStack_120f8,this + 0x30,(PrimMeta *)(ulong)(iVar1 + 1),uVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
               (long)auStack_120f0);
    uVar6 = extraout_EDX;
    if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
      operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      aaStack_120e8[0]._M_allocated_capacity + 1);
      uVar6 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_((string *)auStack_120f8,(pprint *)((ulong)shader & 0xffffffff),uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                        (long)auStack_120f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    uVar6 = extraout_EDX_01;
    if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
      operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      aaStack_120e8[0]._M_allocated_capacity + 1);
      uVar6 = extraout_EDX_02;
    }
  }
  puVar11 = local_c488 + 8;
  pprint::Indent_abi_cxx11_((string *)auStack_120f8,this_01,uVar6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      (long)auStack_120f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  uVar6 = extraout_EDX_03;
  if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
    operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                    aaStack_120e8[0]._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  if (*(long *)(this + 0x738) != 0) {
    pprint::Indent_abi_cxx11_((string *)auStack_120f8,(pprint *)(ulong)(iVar1 + 1),uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                        (long)auStack_120f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"uniform token info:id = \"",0x19);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)(this + 0x730),*(long *)(this + 0x738));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
    if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
      operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      aaStack_120e8[0]._M_allocated_capacity + 1);
    }
  }
  puVar7 = auStack_120f0 + 8;
  this_00 = this + 0x750;
  value::Value::get_value<tinyusdz::UsdPrimvarReader<float>>
            ((optional<tinyusdz::UsdPrimvarReader<float>_> *)auStack_120f8,(Value *)this_00,false);
  local_9548 = auStack_120f8[0];
  if (auStack_120f8[0] == (stringstream)0x1) {
    UsdPrimvarReader<float>::UsdPrimvarReader(&local_9540,(UsdPrimvarReader<float> *)auStack_120f0);
  }
  if (auStack_120f8[0] == (stringstream)0x1) {
    UsdPrimvarReader<float>::~UsdPrimvarReader((UsdPrimvarReader<float> *)auStack_120f0);
  }
  if (local_9548 == (stringstream)0x1) {
    uVar10 = iVar1 + 1;
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_120f8);
    poVar3 = (ostream *)(auStack_120f0 + 8);
    local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
    local_ea68[0]._M_local_buf[6] = ':';
    local_ea68[0]._M_local_buf[7] = 'v';
    local_ea68[0]._8_6_ = 0x656d616e7261;
    local_ea78[8] = true;
    local_ea78._9_3_ = 0;
    local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
    local_ea68[0]._M_local_buf[0xe] = '\0';
    local_ea78._0_8_ = local_ea68;
    print_str_attr((string *)local_c490,&local_9540.varname,(string *)local_ea78,uVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
    if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
      operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea78._0_8_ != local_ea68) {
      operator_delete((void *)local_ea78._0_8_,
                      CONCAT17(local_ea68[0]._M_local_buf[7],
                               CONCAT16(local_ea68[0]._M_local_buf[6],
                                        (undefined6)local_ea68[0]._M_allocated_capacity)) + 1);
    }
    local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
    local_ea68[0]._M_local_buf[6] = ':';
    local_ea68[0]._M_local_buf[7] = 'f';
    local_ea68[0]._8_6_ = 0x6361626c6c61;
    local_ea68[0]._M_local_buf[0xe] = 'k';
    local_ea78[8] = true;
    local_ea78._9_3_ = 0;
    local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
    local_ea68[0]._M_local_buf[0xf] = '\0';
    local_ea78._0_8_ = local_ea68;
    print_typed_attr<float>((string *)local_c490,&local_9540.fallback,(string *)local_ea78,uVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
    if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
      operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea78._0_8_ != local_ea68) {
      operator_delete((void *)local_ea78._0_8_,
                      CONCAT17(local_ea68[0]._M_local_buf[7],
                               CONCAT16(local_ea68[0]._M_local_buf[6],
                                        (undefined6)local_ea68[0]._M_allocated_capacity)) + 1);
    }
    local_ea68[0]._M_allocated_capacity._0_6_ = 0x74757074756f;
    local_ea68[0]._M_local_buf[6] = 's';
    local_ea68[0]._M_local_buf[7] = ':';
    local_ea68[0]._8_6_ = 0x746c75736572;
    local_ea78[8] = true;
    local_ea78._9_3_ = 0;
    local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
    local_ea68[0]._M_local_buf[0xe] = '\0';
    uVar4 = uVar10;
    local_ea78._0_8_ = local_ea68;
    print_typed_terminal_attr<float>
              ((string *)local_c490,&local_9540.result,(string *)local_ea78,uVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
    if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
      operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea78._0_8_ != local_ea68) {
      operator_delete((void *)local_ea78._0_8_,
                      CONCAT17(local_ea68[0]._M_local_buf[7],
                               CONCAT16(local_ea68[0]._M_local_buf[6],
                                        (undefined6)local_ea68[0]._M_allocated_capacity)) + 1);
    }
    print_common_shader_params_abi_cxx11_
              ((string *)local_c490,(tinyusdz *)&local_9540,(ShaderNode *)(ulong)uVar10,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
    if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
      operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._8_8_ + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)auStack_120f8);
    std::ios_base::~ios_base(aiStack_12078);
    std::__ostream_insert<char,std::char_traits<char>>
              (aoStack_12270,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
    uVar5 = extraout_EDX_05;
    if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
      operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._8_8_ + 1);
      uVar5 = extraout_EDX_06;
    }
  }
  else {
    value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
              ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)auStack_120f8,
               (Value *)this_00,false);
    local_3100 = auStack_120f8[0];
    if (auStack_120f8[0] == (stringstream)0x1) {
      UsdPrimvarReader<std::array<float,_2UL>_>::UsdPrimvarReader
                (&local_30f8,(UsdPrimvarReader<std::array<float,_2UL>_> *)auStack_120f0);
    }
    if (auStack_120f8[0] == (stringstream)0x1) {
      UsdPrimvarReader<std::array<float,_2UL>_>::~UsdPrimvarReader
                ((UsdPrimvarReader<std::array<float,_2UL>_> *)auStack_120f0);
    }
    if (local_3100 == (stringstream)0x1) {
      print_shader_params_abi_cxx11_
                ((string *)auStack_120f8,(tinyusdz *)&local_30f8,
                 (UsdPrimvarReader_float2 *)(ulong)(iVar1 + 1),uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                 (long)auStack_120f0);
      uVar5 = extraout_EDX_07;
      if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7) {
        operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                        aaStack_120e8[0]._M_allocated_capacity + 1);
        uVar5 = extraout_EDX_08;
      }
    }
    else {
      value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)auStack_120f8,
                 (Value *)this_00,false);
      local_8700 = auStack_120f8[0];
      if (auStack_120f8[0] == (stringstream)0x1) {
        UsdPrimvarReader<std::array<float,_3UL>_>::UsdPrimvarReader
                  (&local_86f8,(UsdPrimvarReader<std::array<float,_3UL>_> *)auStack_120f0);
      }
      if (auStack_120f8[0] == (stringstream)0x1) {
        UsdPrimvarReader<std::array<float,_3UL>_>::~UsdPrimvarReader
                  ((UsdPrimvarReader<std::array<float,_3UL>_> *)auStack_120f0);
      }
      if (local_8700 == (stringstream)0x1) {
        uVar10 = iVar1 + 1;
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_120f8);
        poVar3 = (ostream *)(auStack_120f0 + 8);
        local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
        local_ea68[0]._M_local_buf[6] = ':';
        local_ea68[0]._M_local_buf[7] = 'v';
        local_ea68[0]._8_6_ = 0x656d616e7261;
        local_ea78[8] = true;
        local_ea78._9_3_ = 0;
        local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
        local_ea68[0]._M_local_buf[0xe] = '\0';
        local_ea78._0_8_ = local_ea68;
        print_str_attr((string *)local_c490,&local_86f8.varname,(string *)local_ea78,uVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
        if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
          operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                          local_c488._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ea78._0_8_ != local_ea68) {
          operator_delete((void *)local_ea78._0_8_,
                          CONCAT17(local_ea68[0]._M_local_buf[7],
                                   CONCAT16(local_ea68[0]._M_local_buf[6],
                                            (undefined6)local_ea68[0]._M_allocated_capacity)) + 1);
        }
        local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
        local_ea68[0]._M_local_buf[6] = ':';
        local_ea68[0]._M_local_buf[7] = 'f';
        local_ea68[0]._8_6_ = 0x6361626c6c61;
        local_ea68[0]._M_local_buf[0xe] = 'k';
        local_ea78[8] = true;
        local_ea78._9_3_ = 0;
        local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
        local_ea68[0]._M_local_buf[0xf] = '\0';
        local_ea78._0_8_ = local_ea68;
        print_typed_attr<std::array<float,3ul>>
                  ((string *)local_c490,(tinyusdz *)&local_86f8.fallback,
                   (TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)local_ea78,
                   (string *)(ulong)uVar10,uVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
        if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
          operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                          local_c488._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ea78._0_8_ != local_ea68) {
          operator_delete((void *)local_ea78._0_8_,
                          CONCAT17(local_ea68[0]._M_local_buf[7],
                                   CONCAT16(local_ea68[0]._M_local_buf[6],
                                            (undefined6)local_ea68[0]._M_allocated_capacity)) + 1);
        }
        local_ea68[0]._M_allocated_capacity._0_6_ = 0x74757074756f;
        local_ea68[0]._M_local_buf[6] = 's';
        local_ea68[0]._M_local_buf[7] = ':';
        local_ea68[0]._8_6_ = 0x746c75736572;
        local_ea78[8] = true;
        local_ea78._9_3_ = 0;
        local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
        local_ea68[0]._M_local_buf[0xe] = '\0';
        uVar4 = uVar10;
        local_ea78._0_8_ = local_ea68;
        print_typed_terminal_attr<std::array<float,3ul>>
                  ((string *)local_c490,(tinyusdz *)&local_86f8.result,
                   (TypedTerminalAttribute<std::array<float,_3UL>_> *)local_ea78,
                   (string *)(ulong)uVar10,uVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
        if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
          operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                          local_c488._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ea78._0_8_ != local_ea68) {
          operator_delete((void *)local_ea78._0_8_,
                          CONCAT17(local_ea68[0]._M_local_buf[7],
                                   CONCAT16(local_ea68[0]._M_local_buf[6],
                                            (undefined6)local_ea68[0]._M_allocated_capacity)) + 1);
        }
        print_common_shader_params_abi_cxx11_
                  ((string *)local_c490,(tinyusdz *)&local_86f8,(ShaderNode *)(ulong)uVar10,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(auStack_120f0 + 8),(char *)CONCAT71(local_c490._1_7_,local_c490[0]),
                   local_c488._0_8_);
        if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
          operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                          local_c488._8_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_120f8);
        std::ios_base::~ios_base(aiStack_12078);
        std::__ostream_insert<char,std::char_traits<char>>
                  (aoStack_12270,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
        uVar5 = extraout_EDX_09;
        if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
          operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                          local_c488._8_8_ + 1);
          uVar5 = extraout_EDX_10;
        }
      }
      else {
        value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                  ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)auStack_120f8,
                   (Value *)this_00,false);
        local_78b0 = auStack_120f8[0];
        if (auStack_120f8[0] == (stringstream)0x1) {
          UsdPrimvarReader<std::array<float,_4UL>_>::UsdPrimvarReader
                    (&local_78a8,(UsdPrimvarReader<std::array<float,_4UL>_> *)auStack_120f0);
        }
        if (auStack_120f8[0] == (stringstream)0x1) {
          UsdPrimvarReader<std::array<float,_4UL>_>::~UsdPrimvarReader
                    ((UsdPrimvarReader<std::array<float,_4UL>_> *)auStack_120f0);
        }
        if (local_78b0 == (stringstream)0x1) {
          uVar10 = iVar1 + 1;
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_120f8);
          poVar3 = (ostream *)(auStack_120f0 + 8);
          local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
          local_ea68[0]._M_local_buf[6] = ':';
          local_ea68[0]._M_local_buf[7] = 'v';
          local_ea68[0]._8_6_ = 0x656d616e7261;
          local_ea78[8] = true;
          local_ea78._9_3_ = 0;
          local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
          local_ea68[0]._M_local_buf[0xe] = '\0';
          local_ea78._0_8_ = local_ea68;
          print_str_attr((string *)local_c490,&local_78a8.varname,(string *)local_ea78,uVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
          if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
            operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                            local_c488._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ea78._0_8_ != local_ea68) {
            operator_delete((void *)local_ea78._0_8_,
                            CONCAT17(local_ea68[0]._M_local_buf[7],
                                     CONCAT16(local_ea68[0]._M_local_buf[6],
                                              (undefined6)local_ea68[0]._M_allocated_capacity)) + 1)
            ;
          }
          local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
          local_ea68[0]._M_local_buf[6] = ':';
          local_ea68[0]._M_local_buf[7] = 'f';
          local_ea68[0]._8_6_ = 0x6361626c6c61;
          local_ea68[0]._M_local_buf[0xe] = 'k';
          local_ea78[8] = true;
          local_ea78._9_3_ = 0;
          local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
          local_ea68[0]._M_local_buf[0xf] = '\0';
          local_ea78._0_8_ = local_ea68;
          print_typed_attr<std::array<float,4ul>>
                    ((string *)local_c490,(tinyusdz *)&local_78a8.fallback,
                     (TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *)local_ea78,
                     (string *)(ulong)uVar10,uVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
          if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
            operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                            local_c488._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ea78._0_8_ != local_ea68) {
            operator_delete((void *)local_ea78._0_8_,
                            CONCAT17(local_ea68[0]._M_local_buf[7],
                                     CONCAT16(local_ea68[0]._M_local_buf[6],
                                              (undefined6)local_ea68[0]._M_allocated_capacity)) + 1)
            ;
          }
          local_ea68[0]._M_allocated_capacity._0_6_ = 0x74757074756f;
          local_ea68[0]._M_local_buf[6] = 's';
          local_ea68[0]._M_local_buf[7] = ':';
          local_ea68[0]._8_6_ = 0x746c75736572;
          local_ea78[8] = true;
          local_ea78._9_3_ = 0;
          local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
          local_ea68[0]._M_local_buf[0xe] = '\0';
          uVar4 = uVar10;
          local_ea78._0_8_ = local_ea68;
          print_typed_terminal_attr<std::array<float,4ul>>
                    ((string *)local_c490,(tinyusdz *)&local_78a8.result,
                     (TypedTerminalAttribute<std::array<float,_4UL>_> *)local_ea78,
                     (string *)(ulong)uVar10,uVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
          if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
            operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                            local_c488._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ea78._0_8_ != local_ea68) {
            operator_delete((void *)local_ea78._0_8_,
                            CONCAT17(local_ea68[0]._M_local_buf[7],
                                     CONCAT16(local_ea68[0]._M_local_buf[6],
                                              (undefined6)local_ea68[0]._M_allocated_capacity)) + 1)
            ;
          }
          print_common_shader_params_abi_cxx11_
                    ((string *)local_c490,(tinyusdz *)&local_78a8,(ShaderNode *)(ulong)uVar10,uVar4)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(auStack_120f0 + 8),(char *)CONCAT71(local_c490._1_7_,local_c490[0])
                     ,local_c488._0_8_);
          if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
            operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                            local_c488._8_8_ + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)auStack_120f8);
          std::ios_base::~ios_base(aiStack_12078);
          std::__ostream_insert<char,std::char_traits<char>>
                    (aoStack_12270,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_
                    );
          uVar5 = extraout_EDX_11;
          if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
            operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                            local_c488._8_8_ + 1);
            uVar5 = extraout_EDX_12;
          }
        }
        else {
          value::Value::get_value<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                    ((optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_120f8,(Value *)this_00,false);
          local_6a58 = auStack_120f8[0];
          if (auStack_120f8[0] == (stringstream)0x1) {
            UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::UsdPrimvarReader(&local_6a50,
                               (UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)auStack_120f0);
          }
          if (auStack_120f8[0] == (stringstream)0x1) {
            UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)auStack_120f0);
          }
          if (local_6a58 == (stringstream)0x1) {
            uVar10 = iVar1 + 1;
            std::__cxx11::stringstream::stringstream((stringstream *)auStack_120f8);
            poVar3 = (ostream *)(auStack_120f0 + 8);
            local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
            local_ea68[0]._M_local_buf[6] = ':';
            local_ea68[0]._M_local_buf[7] = 'v';
            local_ea68[0]._8_6_ = 0x656d616e7261;
            local_ea78[8] = true;
            local_ea78._9_3_ = 0;
            local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
            local_ea68[0]._M_local_buf[0xe] = '\0';
            local_ea78._0_8_ = local_ea68;
            print_str_attr((string *)local_c490,&local_6a50.varname,(string *)local_ea78,uVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
            if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
              operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                              local_c488._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ea78._0_8_ != local_ea68) {
              operator_delete((void *)local_ea78._0_8_,
                              CONCAT17(local_ea68[0]._M_local_buf[7],
                                       CONCAT16(local_ea68[0]._M_local_buf[6],
                                                (undefined6)local_ea68[0]._M_allocated_capacity)) +
                              1);
            }
            local_ea68[0]._M_allocated_capacity._0_6_ = 0x737475706e69;
            local_ea68[0]._M_local_buf[6] = ':';
            local_ea68[0]._M_local_buf[7] = 'f';
            local_ea68[0]._8_6_ = 0x6361626c6c61;
            local_ea68[0]._M_local_buf[0xe] = 'k';
            local_ea78[8] = true;
            local_ea78._9_3_ = 0;
            local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
            local_ea68[0]._M_local_buf[0xf] = '\0';
            local_ea78._0_8_ = local_ea68;
            print_typed_attr<std::__cxx11::string>
                      ((string *)local_c490,(tinyusdz *)&local_6a50.fallback,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_ea78,(string *)(ulong)uVar10,uVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
            if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
              operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                              local_c488._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ea78._0_8_ != local_ea68) {
              operator_delete((void *)local_ea78._0_8_,
                              CONCAT17(local_ea68[0]._M_local_buf[7],
                                       CONCAT16(local_ea68[0]._M_local_buf[6],
                                                (undefined6)local_ea68[0]._M_allocated_capacity)) +
                              1);
            }
            local_ea68[0]._M_allocated_capacity._0_6_ = 0x74757074756f;
            local_ea68[0]._M_local_buf[6] = 's';
            local_ea68[0]._M_local_buf[7] = ':';
            local_ea68[0]._8_6_ = 0x746c75736572;
            local_ea78[8] = true;
            local_ea78._9_3_ = 0;
            local_ea78._12_4_ = (storage_t<unsigned_int>)0x0;
            local_ea68[0]._M_local_buf[0xe] = '\0';
            uVar4 = uVar10;
            local_ea78._0_8_ = local_ea68;
            print_typed_terminal_attr<std::__cxx11::string>
                      ((string *)local_c490,(tinyusdz *)&local_6a50.result,
                       (TypedTerminalAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_ea78,(string *)(ulong)uVar10,uVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
            if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
              operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                              local_c488._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ea78._0_8_ != local_ea68) {
              operator_delete((void *)local_ea78._0_8_,
                              CONCAT17(local_ea68[0]._M_local_buf[7],
                                       CONCAT16(local_ea68[0]._M_local_buf[6],
                                                (undefined6)local_ea68[0]._M_allocated_capacity)) +
                              1);
            }
            print_common_shader_params_abi_cxx11_
                      ((string *)local_c490,(tinyusdz *)&local_6a50,(ShaderNode *)(ulong)uVar10,
                       uVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(auStack_120f0 + 8),
                       (char *)CONCAT71(local_c490._1_7_,local_c490[0]),local_c488._0_8_);
            if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
              operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                              local_c488._8_8_ + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)auStack_120f8);
            std::ios_base::~ios_base(aiStack_12078);
            std::__ostream_insert<char,std::char_traits<char>>
                      (aoStack_12270,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),
                       local_c488._0_8_);
            uVar5 = extraout_EDX_13;
            if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
              operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                              local_c488._8_8_ + 1);
              uVar5 = extraout_EDX_14;
            }
          }
          else {
            value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                      ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> *)
                       auStack_120f8,(Value *)this_00,false);
            local_3f50 = auStack_120f8[0];
            if (auStack_120f8[0] == (stringstream)0x1) {
              UsdPrimvarReader<tinyusdz::value::normal3f>::UsdPrimvarReader
                        (&local_3f48,(UsdPrimvarReader<tinyusdz::value::normal3f> *)auStack_120f0);
            }
            if (auStack_120f8[0] == (stringstream)0x1) {
              UsdPrimvarReader<tinyusdz::value::normal3f>::~UsdPrimvarReader
                        ((UsdPrimvarReader<tinyusdz::value::normal3f> *)auStack_120f0);
            }
            if (local_3f50 == (stringstream)0x1) {
              print_shader_params_abi_cxx11_
                        ((string *)auStack_120f8,(tinyusdz *)&local_3f48,
                         (UsdPrimvarReader_normal *)(ulong)(iVar1 + 1),uVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                         (long)auStack_120f0);
              uVar5 = extraout_EDX_15;
              if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7) {
                operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                aaStack_120e8[0]._M_allocated_capacity + 1);
                uVar5 = extraout_EDX_16;
              }
            }
            else {
              value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                        ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> *)
                         auStack_120f8,(Value *)this_00,false);
              local_4da0 = auStack_120f8[0];
              if (auStack_120f8[0] == (stringstream)0x1) {
                UsdPrimvarReader<tinyusdz::value::vector3f>::UsdPrimvarReader
                          (&local_4d98,(UsdPrimvarReader<tinyusdz::value::vector3f> *)auStack_120f0)
                ;
              }
              if (auStack_120f8[0] == (stringstream)0x1) {
                UsdPrimvarReader<tinyusdz::value::vector3f>::~UsdPrimvarReader
                          ((UsdPrimvarReader<tinyusdz::value::vector3f> *)auStack_120f0);
              }
              if (local_4da0 == (stringstream)0x1) {
                print_shader_params_abi_cxx11_
                          ((string *)auStack_120f8,(tinyusdz *)&local_4d98,
                           (UsdPrimvarReader_vector *)(ulong)(iVar1 + 1),uVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                           (long)auStack_120f0);
                uVar5 = extraout_EDX_17;
                if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7) {
                  operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                  aaStack_120e8[0]._M_allocated_capacity + 1);
                  uVar5 = extraout_EDX_18;
                }
              }
              else {
                value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                          ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> *)
                           auStack_120f8,(Value *)this_00,false);
                local_5bf0 = auStack_120f8[0];
                if (auStack_120f8[0] == (stringstream)0x1) {
                  UsdPrimvarReader<tinyusdz::value::point3f>::UsdPrimvarReader
                            (&local_5be8,(UsdPrimvarReader<tinyusdz::value::point3f> *)auStack_120f0
                            );
                }
                if (auStack_120f8[0] == (stringstream)0x1) {
                  UsdPrimvarReader<tinyusdz::value::point3f>::~UsdPrimvarReader
                            ((UsdPrimvarReader<tinyusdz::value::point3f> *)auStack_120f0);
                }
                if (local_5bf0 == (stringstream)0x1) {
                  print_shader_params_abi_cxx11_
                            ((string *)auStack_120f8,(tinyusdz *)&local_5be8,
                             (UsdPrimvarReader_point *)(ulong)(iVar1 + 1),uVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                             (long)auStack_120f0);
                  uVar5 = extraout_EDX_19;
                  if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7) {
                    operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                    aaStack_120e8[0]._M_allocated_capacity + 1);
                    uVar5 = extraout_EDX_20;
                  }
                }
                else {
                  value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                            ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                             auStack_120f8,(Value *)this_00,false);
                  local_22b0 = auStack_120f8[0];
                  if (auStack_120f8[0] == (stringstream)0x1) {
                    UsdPrimvarReader<tinyusdz::value::matrix4d>::UsdPrimvarReader
                              (&local_22a8,
                               (UsdPrimvarReader<tinyusdz::value::matrix4d> *)auStack_120f0);
                  }
                  if (auStack_120f8[0] == (stringstream)0x1) {
                    UsdPrimvarReader<tinyusdz::value::matrix4d>::~UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::matrix4d> *)auStack_120f0);
                  }
                  if (local_22b0 == (stringstream)0x1) {
                    print_shader_params_abi_cxx11_
                              ((string *)auStack_120f8,(tinyusdz *)&local_22a8,
                               (UsdPrimvarReader_matrix *)(ulong)(iVar1 + 1),uVar5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                               (long)auStack_120f0);
                    uVar5 = extraout_EDX_21;
                    if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7) {
                      operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                      aaStack_120e8[0]._M_allocated_capacity + 1);
                      uVar5 = extraout_EDX_22;
                    }
                  }
                  else {
                    value::Value::get_value<tinyusdz::UsdUVTexture>
                              ((optional<tinyusdz::UsdUVTexture> *)auStack_120f8,(Value *)this_00,
                               false);
                    local_ea78[0] = auStack_120f8[0];
                    if (auStack_120f8[0] == (stringstream)0x1) {
                      UsdUVTexture::UsdUVTexture
                                ((UsdUVTexture *)(local_ea78 + 8),(UsdUVTexture *)auStack_120f0);
                    }
                    if (auStack_120f8[0] == (stringstream)0x1) {
                      UsdUVTexture::~UsdUVTexture((UsdUVTexture *)auStack_120f0);
                    }
                    if ((bool)local_ea78[0] == true) {
                      print_shader_params_abi_cxx11_
                                ((string *)auStack_120f8,(tinyusdz *)(local_ea78 + 8),
                                 (UsdUVTexture *)(ulong)(iVar1 + 1),uVar5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (aoStack_12270,
                                 (char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                 (long)auStack_120f0);
                      uVar5 = extraout_EDX_23;
                      if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7) {
                        operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0])
                                        ,aaStack_120e8[0]._M_allocated_capacity + 1);
                        uVar5 = extraout_EDX_24;
                      }
                    }
                    else {
                      value::Value::get_value<tinyusdz::UsdTransform2d>
                                ((optional<tinyusdz::UsdTransform2d> *)auStack_120f8,
                                 (Value *)this_00,false);
                      local_13e8 = auStack_120f8[0];
                      if (auStack_120f8[0] == (stringstream)0x1) {
                        UsdTransform2d::UsdTransform2d(&local_13e0,(UsdTransform2d *)auStack_120f0);
                      }
                      if (auStack_120f8[0] == (stringstream)0x1) {
                        UsdTransform2d::~UsdTransform2d((UsdTransform2d *)auStack_120f0);
                      }
                      if (local_13e8 == (stringstream)0x1) {
                        print_shader_params_abi_cxx11_
                                  ((string *)auStack_120f8,(tinyusdz *)&local_13e0,
                                   (UsdTransform2d *)(ulong)(iVar1 + 1),uVar5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (aoStack_12270,
                                   (char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                   (long)auStack_120f0);
                        uVar5 = extraout_EDX_25;
                        if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != puVar7)
                        {
                          operator_delete((undefined1 *)
                                          CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                                          aaStack_120e8[0]._M_allocated_capacity + 1);
                          uVar5 = extraout_EDX_26;
                        }
                      }
                      else {
                        value::Value::get_value<tinyusdz::UsdPreviewSurface>
                                  ((optional<tinyusdz::UsdPreviewSurface> *)local_c490,
                                   (Value *)this_00,false);
                        auStack_120f8[0] = local_c490[0];
                        if (local_c490[0] == (stringstream)0x1) {
                          UsdPreviewSurface::UsdPreviewSurface
                                    ((UsdPreviewSurface *)auStack_120f0,
                                     (UsdPreviewSurface *)local_c488);
                        }
                        if (local_c490[0] == (stringstream)0x1) {
                          UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)local_c488);
                        }
                        if (auStack_120f8[0] == (stringstream)0x1) {
                          print_shader_params_abi_cxx11_
                                    ((string *)local_c490,(tinyusdz *)auStack_120f0,
                                     (UsdPreviewSurface *)(ulong)(iVar1 + 1),uVar5);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (aoStack_12270,(char *)CONCAT71(local_c490._1_7_,local_c490[0]),
                                     local_c488._0_8_);
                          uVar5 = extraout_EDX_27;
                          if ((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]) != puVar11) {
                            operator_delete((undefined1 *)CONCAT71(local_c490._1_7_,local_c490[0]),
                                            local_c488._8_8_ + 1);
                            uVar5 = extraout_EDX_28;
                          }
                        }
                        else {
                          value::Value::get_value<tinyusdz::ShaderNode>
                                    ((optional<tinyusdz::ShaderNode> *)local_f1b0,(Value *)this_00,
                                     false);
                          local_c490[0] = local_f1b0[0];
                          uVar9 = extraout_EDX_29;
                          if (local_f1b0[0] == (stringstream)0x1) {
                            UsdShadePrim::UsdShadePrim
                                      ((UsdShadePrim *)local_c488,(UsdShadePrim *)(local_f1b0 + 8));
                            uVar9 = extraout_EDX_30;
                          }
                          if (local_f1b0[0] == (stringstream)0x1) {
                            UsdShadePrim::~UsdShadePrim((UsdShadePrim *)(local_f1b0 + 8));
                            uVar9 = extraout_EDX_31;
                          }
                          if (local_c490[0] == (stringstream)0x1) {
                            print_common_shader_params_abi_cxx11_
                                      ((string *)local_f1b0,(tinyusdz *)local_c488,
                                       (ShaderNode *)(ulong)(iVar1 + 1),uVar5);
                            pcVar8 = (char *)CONCAT71(local_f1b0._1_7_,local_f1b0[0]);
                            poVar3 = aoStack_12270;
                          }
                          else {
                            pprint::Indent_abi_cxx11_
                                      ((string *)local_f1b0,(pprint *)(ulong)(iVar1 + 1),uVar9);
                            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                               (aoStack_12270,
                                                (char *)CONCAT71(local_f1b0._1_7_,local_f1b0[0]),
                                                local_f1b0._8_8_);
                            pcVar8 = "[???] Invalid ShaderNode in Shader Prim\n";
                            local_f1b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x28;
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar3,pcVar8,local_f1b0._8_8_);
                          uVar5 = extraout_EDX_32;
                          if ((undefined1 *)CONCAT71(local_f1b0._1_7_,local_f1b0[0]) !=
                              local_f1b0 + 0x10) {
                            operator_delete((undefined1 *)CONCAT71(local_f1b0._1_7_,local_f1b0[0]),
                                            local_f1b0._16_8_ + 1);
                            uVar5 = extraout_EDX_33;
                          }
                          if (local_c490[0] == (stringstream)0x1) {
                            UsdShadePrim::~UsdShadePrim((UsdShadePrim *)local_c488);
                            uVar5 = extraout_EDX_34;
                          }
                        }
                        if (auStack_120f8[0] == (stringstream)0x1) {
                          UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)auStack_120f0);
                          uVar5 = extraout_EDX_35;
                        }
                      }
                      if (local_13e8 == (stringstream)0x1) {
                        UsdTransform2d::~UsdTransform2d(&local_13e0);
                        uVar5 = extraout_EDX_36;
                      }
                    }
                    if ((bool)local_ea78[0] == true) {
                      UsdUVTexture::~UsdUVTexture((UsdUVTexture *)(local_ea78 + 8));
                      uVar5 = extraout_EDX_37;
                    }
                  }
                  if (local_22b0 == (stringstream)0x1) {
                    UsdPrimvarReader<tinyusdz::value::matrix4d>::~UsdPrimvarReader(&local_22a8);
                    uVar5 = extraout_EDX_38;
                  }
                }
                if (local_5bf0 == (stringstream)0x1) {
                  UsdPrimvarReader<tinyusdz::value::point3f>::~UsdPrimvarReader(&local_5be8);
                  uVar5 = extraout_EDX_39;
                }
              }
              if (local_4da0 == (stringstream)0x1) {
                UsdPrimvarReader<tinyusdz::value::vector3f>::~UsdPrimvarReader(&local_4d98);
                uVar5 = extraout_EDX_40;
              }
            }
            if (local_3f50 == (stringstream)0x1) {
              UsdPrimvarReader<tinyusdz::value::normal3f>::~UsdPrimvarReader(&local_3f48);
              uVar5 = extraout_EDX_41;
            }
          }
          if (local_6a58 == (stringstream)0x1) {
            UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~UsdPrimvarReader(&local_6a50);
            uVar5 = extraout_EDX_42;
          }
        }
        if (local_78b0 == (stringstream)0x1) {
          UsdPrimvarReader<std::array<float,_4UL>_>::~UsdPrimvarReader(&local_78a8);
          uVar5 = extraout_EDX_43;
        }
      }
      if (local_8700 == (stringstream)0x1) {
        UsdPrimvarReader<std::array<float,_3UL>_>::~UsdPrimvarReader(&local_86f8);
        uVar5 = extraout_EDX_44;
      }
    }
    if (local_3100 == (stringstream)0x1) {
      UsdPrimvarReader<std::array<float,_2UL>_>::~UsdPrimvarReader(&local_30f8);
      uVar5 = extraout_EDX_45;
    }
  }
  if (local_9548 == (stringstream)0x1) {
    UsdPrimvarReader<float>::~UsdPrimvarReader(&local_9540);
    uVar5 = extraout_EDX_46;
  }
  cStack_1228c = (char)indent;
  if (cStack_1228c != '\0') {
    pprint::Indent_abi_cxx11_((string *)auStack_120f8,(pprint *)((ulong)shader & 0xffffffff),uVar5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (aoStack_12270,(char *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                        (long)auStack_120f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
    if ((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]) != auStack_120f0 + 8) {
      operator_delete((undefined1 *)CONCAT71(auStack_120f8._1_7_,auStack_120f8[0]),
                      aaStack_120e8[0]._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_12280);
  std::ios_base::~ios_base(aiStack_12200);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Shader &shader, const uint32_t indent,
                      bool closing_brace) {
  // generic Shader class
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(shader.spec) << " Shader \""
     << shader.name << "\"\n";
  if (shader.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(shader.metas(), indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  if (shader.info_id.size()) {
    ss << pprint::Indent(indent + 1) << "uniform token info:id = \""
       << shader.info_id << "\"\n";
  }

  if (auto pvr = shader.value.get_value<UsdPrimvarReader_float>()) {
    ss << print_shader_params(pvr.value(), indent + 1);
  } else if (auto pvr2 = shader.value.get_value<UsdPrimvarReader_float2>()) {
    ss << print_shader_params(pvr2.value(), indent + 1);
  } else if (auto pvr3 = shader.value.get_value<UsdPrimvarReader_float3>()) {
    ss << print_shader_params(pvr3.value(), indent + 1);
  } else if (auto pvr4 = shader.value.get_value<UsdPrimvarReader_float4>()) {
    ss << print_shader_params(pvr4.value(), indent + 1);
  } else if (auto pvrs = shader.value.get_value<UsdPrimvarReader_string>()) {
    ss << print_shader_params(pvrs.value(), indent + 1);
  } else if (auto pvrn = shader.value.get_value<UsdPrimvarReader_normal>()) {
    ss << print_shader_params(pvrn.value(), indent + 1);
  } else if (auto pvrv = shader.value.get_value<UsdPrimvarReader_vector>()) {
    ss << print_shader_params(pvrv.value(), indent + 1);
  } else if (auto pvrp = shader.value.get_value<UsdPrimvarReader_point>()) {
    ss << print_shader_params(pvrp.value(), indent + 1);
  } else if (auto pvrm = shader.value.get_value<UsdPrimvarReader_matrix>()) {
    ss << print_shader_params(pvrm.value(), indent + 1);
  } else if (auto pvtex = shader.value.get_value<UsdUVTexture>()) {
    ss << print_shader_params(pvtex.value(), indent + 1);
  } else if (auto pvtx2d = shader.value.get_value<UsdTransform2d>()) {
    ss << print_shader_params(pvtx2d.value(), indent + 1);
  } else if (auto pvs = shader.value.get_value<UsdPreviewSurface>()) {
    ss << print_shader_params(pvs.value(), indent + 1);
  } else if (auto pvsn = shader.value.get_value<ShaderNode>()) {
    // Generic ShaderNode
    ss << print_common_shader_params(pvsn.value(), indent + 1);
  } else {
    ss << pprint::Indent(indent + 1)
       << "[???] Invalid ShaderNode in Shader Prim\n";
  }

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}